

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

void fs_event_cb_file_current_dir(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  
  if (fs_event_cb_called == 0) {
    fs_event_cb_called = 1;
    if (handle != &fs_event) goto LAB_001511f4;
    if (status != 0) goto LAB_001511f9;
    if (events == 2) {
      iVar1 = strcmp(filename,"watch_file");
      if (iVar1 == 0) {
        uv_timer_init(fs_event.loop,&fs_event_cb_file_current_dir::timer);
        fs_event_cb_file_current_dir::timer.data = &fs_event;
        uv_timer_start(&fs_event_cb_file_current_dir::timer,timer_cb_close_handle,0xfa,0);
        return;
      }
      goto LAB_00151203;
    }
  }
  else {
    fs_event_cb_file_current_dir_cold_1();
LAB_001511f4:
    fs_event_cb_file_current_dir_cold_2();
LAB_001511f9:
    fs_event_cb_file_current_dir_cold_3();
  }
  fs_event_cb_file_current_dir_cold_4();
LAB_00151203:
  fs_event_cb_file_current_dir_cold_5();
  uv_close();
  touch_file("watch_file");
  timer_cb_touch_called = timer_cb_touch_called + 1;
  return;
}

Assistant:

static void fs_event_cb_file_current_dir(uv_fs_event_t* handle,
                                         const char* filename,
                                         int events,
                                         int status) {
  ASSERT(fs_event_cb_called == 0);
  ++fs_event_cb_called;
  ASSERT(status == 0);
#if defined(__APPLE__) || defined(__linux__)
  ASSERT(strcmp(filename, "watch_file") == 0);
#else
  ASSERT(filename == NULL || strcmp(filename, "watch_file") == 0);
#endif
  uv_close((uv_handle_t*)handle, NULL);
}